

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_partial_sign
              (secp256k1_context *ctx,secp256k1_musig_partial_sig *partial_sig,
              secp256k1_musig_secnonce *secnonce,secp256k1_keypair *keypair,
              secp256k1_musig_keyagg_cache *keyagg_cache,secp256k1_musig_session *session)

{
  uchar *puVar1;
  secp256k1_musig_partial_sig *psVar2;
  int iVar3;
  long lVar4;
  secp256k1_keypair *psVar5;
  uchar *p1;
  secp256k1_keypair *psVar6;
  char *pcVar7;
  byte bVar8;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  undefined1 auVar9 [16];
  secp256k1_scalar sk;
  secp256k1_scalar k [2];
  secp256k1_ge pk;
  secp256k1_ge keypair_pk;
  secp256k1_musig_session_internal session_i;
  secp256k1_keyagg_cache_internal cache_i;
  secp256k1_scalar s;
  secp256k1_scalar mu;
  secp256k1_scalar local_318;
  secp256k1_musig_partial_sig *local_2f0;
  secp256k1_scalar local_2e8;
  secp256k1_scalar local_2c8;
  secp256k1_ge local_2a8;
  secp256k1_ge local_248;
  secp256k1_musig_session_internal local_1f0;
  secp256k1_keyagg_cache_internal local_168;
  secp256k1_scalar local_70;
  secp256k1_scalar local_50;
  
  local_2f0 = partial_sig;
  if (secnonce == (secp256k1_musig_secnonce *)0x0) {
    secp256k1_musig_partial_sign_cold_7();
    return 0;
  }
  lVar4 = 0;
  psVar5 = keypair;
  do {
    psVar6 = (secp256k1_keypair *)((ulong)psVar5 & 0xffffffff);
    bVar8 = secnonce->data[lVar4];
    bVar10 = secp256k1_musig_secnonce_magic[lVar4];
    psVar5 = (secp256k1_keypair *)(ulong)((uint)bVar8 - (uint)bVar10);
    if (bVar8 == bVar10) {
      psVar5 = psVar6;
    }
    iVar3 = (int)psVar5;
    if (bVar8 != bVar10) goto LAB_00113b31;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  iVar3 = 0;
LAB_00113b31:
  if (iVar3 == 0) {
    bVar8 = 0;
    bVar10 = 0;
    bVar11 = 0;
    bVar12 = 0;
    bVar13 = 0;
    bVar14 = 0;
    bVar15 = 0;
    bVar16 = 0;
    bVar17 = 0;
    bVar18 = 0;
    bVar19 = 0;
    bVar20 = 0;
    bVar21 = 0;
    bVar22 = 0;
    bVar23 = 0;
    bVar24 = 0;
    lVar4 = 4;
    do {
      puVar1 = secnonce->data + lVar4;
      bVar8 = bVar8 | *puVar1;
      bVar10 = bVar10 | puVar1[1];
      bVar11 = bVar11 | puVar1[2];
      bVar12 = bVar12 | puVar1[3];
      bVar13 = bVar13 | puVar1[4];
      bVar14 = bVar14 | puVar1[5];
      bVar15 = bVar15 | puVar1[6];
      bVar16 = bVar16 | puVar1[7];
      bVar17 = bVar17 | puVar1[8];
      bVar18 = bVar18 | puVar1[9];
      bVar19 = bVar19 | puVar1[10];
      bVar20 = bVar20 | puVar1[0xb];
      bVar21 = bVar21 | puVar1[0xc];
      bVar22 = bVar22 | puVar1[0xd];
      bVar23 = bVar23 | puVar1[0xe];
      bVar24 = bVar24 | puVar1[0xf];
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x44);
    auVar9[0] = -(bVar8 == 0);
    auVar9[1] = -(bVar10 == 0);
    auVar9[2] = -(bVar11 == 0);
    auVar9[3] = -(bVar12 == 0);
    auVar9[4] = -(bVar13 == 0);
    auVar9[5] = -(bVar14 == 0);
    auVar9[6] = -(bVar15 == 0);
    auVar9[7] = -(bVar16 == 0);
    auVar9[8] = -(bVar17 == 0);
    auVar9[9] = -(bVar18 == 0);
    auVar9[10] = -(bVar19 == 0);
    auVar9[0xb] = -(bVar20 == 0);
    auVar9[0xc] = -(bVar21 == 0);
    auVar9[0xd] = -(bVar22 == 0);
    auVar9[0xe] = -(bVar23 == 0);
    auVar9[0xf] = -(bVar24 == 0);
    local_168.pk.x.n[0] = local_168.pk.x.n[0] & 0xffffffffffffff00;
    local_1f0.fin_nonce_parity =
         (int)((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar9[0xf] >> 7) << 0xf) == 0xffff);
    if (ctx->declassify != 0) {
      secp256k1_musig_partial_sign_cold_1();
    }
    if (local_1f0.fin_nonce_parity == 0) {
      secp256k1_scalar_set_b32(&local_2e8,secnonce->data + 4,(int *)0x0);
      secp256k1_scalar_set_b32(&local_2c8,secnonce->data + 0x24,(int *)0x0);
      local_168.pk.x.n[0] = *(uint64_t *)(secnonce->data + 0x44);
      local_168.pk.x.n[1] = *(uint64_t *)(secnonce->data + 0x4c);
      local_168.pk.x.n[2] = *(uint64_t *)(secnonce->data + 0x54);
      local_168.pk.x.n[3] = *(uint64_t *)(secnonce->data + 0x5c);
      local_168.pk.x.n[4] = *(uint64_t *)(secnonce->data + 100);
      local_168.pk.y.n[0] = *(uint64_t *)(secnonce->data + 0x6c);
      local_168.pk.y.n[1] = *(uint64_t *)(secnonce->data + 0x74);
      local_168.pk.y.n[2] = *(uint64_t *)(secnonce->data + 0x7c);
      secp256k1_ge_from_storage(&local_2a8,(secp256k1_ge_storage *)&local_168);
      memset(secnonce,0,0x84);
      psVar2 = local_2f0;
      if (local_2f0 == (secp256k1_musig_partial_sig *)0x0) {
        secp256k1_musig_partial_sign_cold_6();
      }
      else if (keypair == (secp256k1_keypair *)0x0) {
        secp256k1_musig_partial_sign_cold_5();
      }
      else if (keyagg_cache == (secp256k1_musig_keyagg_cache *)0x0) {
        secp256k1_musig_partial_sign_cold_4();
      }
      else if (session == (secp256k1_musig_session *)0x0) {
        secp256k1_musig_partial_sign_cold_3();
      }
      else {
        iVar3 = secp256k1_keypair_load(ctx,&local_318,&local_248,keypair);
        if (iVar3 != 0) {
          local_168.pk.x.n[0] = (local_248.x.n[0] - local_2a8.x.n[0]) + 0x3ffffbfffff0bc;
          local_168.pk.x.n[1] = (local_248.x.n[1] - local_2a8.x.n[1]) + 0x3ffffffffffffc;
          local_168.pk.x.n[2] = (local_248.x.n[2] - local_2a8.x.n[2]) + 0x3ffffffffffffc;
          local_168.pk.x.n[3] = (local_248.x.n[3] - local_2a8.x.n[3]) + 0x3ffffffffffffc;
          local_168.pk.x.n[4] = (0x3fffffffffffc - local_2a8.x.n[4]) + local_248.x.n[4];
          iVar3 = secp256k1_fe_impl_normalizes_to_zero((secp256k1_fe *)&local_168);
          if (iVar3 != 0) {
            local_168.pk.x.n[0] = (local_248.y.n[0] - local_2a8.y.n[0]) + 0x3ffffbfffff0bc;
            local_168.pk.x.n[1] = (local_248.y.n[1] - local_2a8.y.n[1]) + 0x3ffffffffffffc;
            local_168.pk.x.n[2] = (local_248.y.n[2] - local_2a8.y.n[2]) + 0x3ffffffffffffc;
            local_168.pk.x.n[3] = (local_248.y.n[3] - local_2a8.y.n[3]) + 0x3ffffffffffffc;
            local_168.pk.x.n[4] = (0x3fffffffffffc - local_2a8.y.n[4]) + local_248.y.n[4];
            iVar3 = secp256k1_fe_impl_normalizes_to_zero((secp256k1_fe *)&local_168);
            if (iVar3 != 0) {
              iVar3 = secp256k1_keyagg_cache_load(ctx,&local_168,keyagg_cache);
              if (iVar3 == 0) {
                return 0;
              }
              if (((uint)local_168.pk.y.n[0] & 1) != local_168.parity_acc) {
                secp256k1_scalar_negate(&local_318,&local_318);
              }
              secp256k1_musig_keyaggcoef_internal
                        (&local_50,local_168.pks_hash,&local_2a8,&local_168.second_pk);
              secp256k1_scalar_mul(&local_318,&local_318,&local_50);
              iVar3 = secp256k1_musig_session_load(ctx,&local_1f0,session);
              if (iVar3 == 0) {
                return 0;
              }
              if (local_1f0.fin_nonce_parity != 0) {
                secp256k1_scalar_negate(&local_2e8,&local_2e8);
                secp256k1_scalar_negate(&local_2c8,&local_2c8);
              }
              secp256k1_scalar_mul(&local_70,&local_1f0.challenge,&local_318);
              secp256k1_scalar_mul(&local_2c8,&local_1f0.noncecoef,&local_2c8);
              secp256k1_scalar_add(&local_2e8,&local_2e8,&local_2c8);
              secp256k1_scalar_add(&local_70,&local_70,&local_2e8);
              psVar2->data[0] = 0xeb;
              psVar2->data[1] = 0xfb;
              psVar2->data[2] = '\x1a';
              psVar2->data[3] = '2';
              secp256k1_scalar_get_b32(psVar2->data + 4,&local_70);
              return 1;
            }
          }
          secp256k1_musig_partial_sign_cold_2();
        }
      }
      return 0;
    }
    pcVar7 = "!is_zero";
  }
  else {
    pcVar7 = "secp256k1_memcmp_var(&secnonce->data[0], secp256k1_musig_secnonce_magic, 4) == 0";
  }
  (*(ctx->illegal_callback).fn)(pcVar7,(ctx->illegal_callback).data);
  memset(secnonce,0,0x84);
  return 0;
}

Assistant:

int secp256k1_musig_partial_sign(const secp256k1_context* ctx, secp256k1_musig_partial_sig *partial_sig, secp256k1_musig_secnonce *secnonce, const secp256k1_keypair *keypair, const secp256k1_musig_keyagg_cache *keyagg_cache, const secp256k1_musig_session *session) {
    secp256k1_scalar sk;
    secp256k1_ge pk, keypair_pk;
    secp256k1_scalar k[2];
    secp256k1_scalar mu, s;
    secp256k1_keyagg_cache_internal cache_i;
    secp256k1_musig_session_internal session_i;
    int ret;

    VERIFY_CHECK(ctx != NULL);

    ARG_CHECK(secnonce != NULL);
    /* Fails if the magic doesn't match */
    ret = secp256k1_musig_secnonce_load(ctx, k, &pk, secnonce);
    /* Set nonce to zero to avoid nonce reuse. This will cause subsequent calls
     * of this function to fail */
    memset(secnonce, 0, sizeof(*secnonce));
    if (!ret) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }

    ARG_CHECK(partial_sig != NULL);
    ARG_CHECK(keypair != NULL);
    ARG_CHECK(keyagg_cache != NULL);
    ARG_CHECK(session != NULL);

    if (!secp256k1_keypair_load(ctx, &sk, &keypair_pk, keypair)) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }
    ARG_CHECK(secp256k1_fe_equal(&pk.x, &keypair_pk.x)
              && secp256k1_fe_equal(&pk.y, &keypair_pk.y));
    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }

    /* Negate sk if secp256k1_fe_is_odd(&cache_i.pk.y)) XOR cache_i.parity_acc.
     * This corresponds to the line "Let d = g⋅gacc⋅d' mod n" in the
     * specification. */
    if ((secp256k1_fe_is_odd(&cache_i.pk.y)
         != cache_i.parity_acc)) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    /* Multiply KeyAgg coefficient */
    secp256k1_musig_keyaggcoef(&mu, &cache_i, &pk);
    secp256k1_scalar_mul(&sk, &sk, &mu);

    if (!secp256k1_musig_session_load(ctx, &session_i, session)) {
        secp256k1_musig_partial_sign_clear(&sk, k);
        return 0;
    }

    if (session_i.fin_nonce_parity) {
        secp256k1_scalar_negate(&k[0], &k[0]);
        secp256k1_scalar_negate(&k[1], &k[1]);
    }

    /* Sign */
    secp256k1_scalar_mul(&s, &session_i.challenge, &sk);
    secp256k1_scalar_mul(&k[1], &session_i.noncecoef, &k[1]);
    secp256k1_scalar_add(&k[0], &k[0], &k[1]);
    secp256k1_scalar_add(&s, &s, &k[0]);
    secp256k1_musig_partial_sig_save(partial_sig, &s);
    secp256k1_musig_partial_sign_clear(&sk, k);
    return 1;
}